

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
          (ShaderImageLoadStoreBase *this,char *src_vs,char *src_tcs,char *src_tes,char *src_gs,
          char *src_fs,bool *result)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLuint GVar2;
  char *pcVar3;
  GLsizei length;
  GLint status;
  GLchar log [1024];
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  int local_440;
  int local_43c;
  GLchar local_438 [1032];
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  local_470 = src_tcs;
  local_468 = src_fs;
  local_460 = src_gs;
  local_458 = src_tes;
  local_450 = src_vs;
  local_448 = src_fs;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (src_vs == (char *)0x0) {
LAB_0098ba6a:
    if (src_tcs != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e88);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_470,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = local_470;
      if (!bVar1) goto LAB_0098bcab;
    }
    if (src_tes != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8e87);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_458,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = local_458;
      if (!bVar1) goto LAB_0098bcab;
    }
    if (src_gs != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8dd9);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_460,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = local_460;
      if (!bVar1) goto LAB_0098bcab;
    }
    if (local_448 != (char *)0x0) {
      GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
      glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
      glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
      glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_468,(GLint *)0x0);
      bVar1 = CompileShader(this,GVar2);
      pcVar3 = local_468;
      if (!bVar1) goto LAB_0098bcab;
    }
    glu::CallLogWrapper::glLinkProgram(this_00,program);
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_43c);
    if (local_43c != 0) {
      return program;
    }
    glu::CallLogWrapper::glGetProgramInfoLog(this_00,program,0x400,&local_440,local_438);
    if (1 < local_440) {
      anon_unknown_0::Output("Program Info Log:\n%s\n",local_438);
    }
    if (local_450 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (local_470 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (local_458 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    if (local_460 != (char *)0x0) {
      anon_unknown_0::Output("%s\n");
    }
    pcVar3 = local_468;
    if (local_468 == (char *)0x0) goto LAB_0098bcb9;
  }
  else {
    GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar2);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
    glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_450,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    src_tcs = local_470;
    pcVar3 = local_450;
    if (bVar1) goto LAB_0098ba6a;
  }
LAB_0098bcab:
  anon_unknown_0::Output("%s\n",pcVar3);
LAB_0098bcb9:
  if (result != (bool *)0x0) {
    *result = false;
  }
  return program;
}

Assistant:

GLuint BuildProgram(const char* src_vs, const char* src_tcs, const char* src_tes, const char* src_gs,
						const char* src_fs, bool* result = NULL)
	{
		const GLuint p = glCreateProgram();

		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_vs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tcs)
		{
			GLuint sh = glCreateShader(GL_TESS_CONTROL_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tcs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tcs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tes)
		{
			GLuint sh = glCreateShader(GL_TESS_EVALUATION_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tes, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tes);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_gs)
		{
			GLuint sh = glCreateShader(GL_GEOMETRY_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_gs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_gs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_fs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (!LinkProgram(p))
		{
			if (src_vs)
				Output("%s\n", src_vs);
			if (src_tcs)
				Output("%s\n", src_tcs);
			if (src_tes)
				Output("%s\n", src_tes);
			if (src_gs)
				Output("%s\n", src_gs);
			if (src_fs)
				Output("%s\n", src_fs);
			if (result)
				*result = false;
			return p;
		}

		return p;
	}